

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexed_heap.h
# Opt level: O3

void __thiscall merlin::indexed_heap::max_heapify(indexed_heap *this,size_t i)

{
  double dVar1;
  pointer pdVar2;
  pointer puVar3;
  pointer puVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  pdVar2 = (this->m_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(this->m_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2 >> 3;
  puVar3 = (this->m_id).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->m_rev).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    uVar7 = i * 2;
    uVar9 = i;
    if ((uVar7 <= uVar8) &&
       (pdVar2[i - 1] <= pdVar2[i * 2 + -1] && pdVar2[i * 2 + -1] != pdVar2[i - 1])) {
      uVar9 = uVar7;
    }
    if ((uVar7 < uVar8) &&
       (pdVar2[uVar9 - 1] <= pdVar2[i * 2] && pdVar2[i * 2] != pdVar2[uVar9 - 1])) {
      uVar9 = i * 2 + 1;
    }
    if (uVar9 == i) break;
    dVar1 = pdVar2[uVar9 - 1];
    pdVar2[uVar9 - 1] = pdVar2[i - 1];
    pdVar2[i - 1] = dVar1;
    uVar5 = puVar3[uVar9 - 1];
    puVar3[uVar9 - 1] = puVar3[i - 1];
    puVar3[i - 1] = uVar5;
    uVar6 = puVar4[puVar3[uVar9 - 1]];
    puVar4[puVar3[uVar9 - 1]] = puVar4[uVar5];
    puVar4[uVar5] = uVar6;
    i = uVar9;
  }
  return;
}

Assistant:

void max_heapify(size_t i) {
		for (;;) {
			size_t left = 2 * i, right = 2 * i + 1, largest = i;
			if (left <= m_p.size() && m_p[left - 1] > m_p[largest - 1])
				largest = left;
			if (right <= m_p.size() && m_p[right - 1] > m_p[largest - 1])
				largest = right;
			if (largest == i)
				return;
			heap_swap(largest, i);
			i = largest;
		}
	}